

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O1

void __thiscall
TPZFrontSym<long_double>::Print(TPZFrontSym<long_double> *this,char *name,ostream *out)

{
  char cVar1;
  size_t sVar2;
  ostream *poVar3;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  cVar1 = (char)out;
  if (name != (char *)0x0) {
    sVar2 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Frontal Matrix Size          ",0x1d);
  poVar3 = std::ostream::_M_insert<long>((long)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Maximum Frontal Matrix Size  ",0x1d);
  plVar4 = (long *)std::ostream::operator<<(out,(this->super_TPZFront<long_double>).fMaxFront);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Local Indexation ",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Position  ",10);
  std::__ostream_insert<char,std::char_traits<char>>(out," Local index",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if (0 < (this->super_TPZFront<long_double>).fLocal.fNElements) {
    lVar9 = 0;
    do {
      poVar3 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"         ",9);
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->super_TPZFront<long_double>).fLocal.fNElements);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Global Indexation ",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Position  ",10);
  std::__ostream_insert<char,std::char_traits<char>>(out," Global index",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if (0 < (this->super_TPZFront<long_double>).fGlobal.super_TPZVec<long>.fNElements) {
    lVar9 = 0;
    do {
      poVar3 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"            ",0xc);
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->super_TPZFront<long_double>).fGlobal.super_TPZVec<long>.fNElements);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Local Freed Equatoins  ",0x17);
  poVar3 = std::ostream::_M_insert<long>((long)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"position ",9);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Local Equation ",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  lVar9 = (this->super_TPZFront<long_double>).fFree.super_TPZManVector<int,_10>.super_TPZVec<int>.
          fNElements;
  if (0 < lVar9) {
    lVar10 = 0;
    do {
      poVar3 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"             ",0xd);
      plVar4 = (long *)std::ostream::operator<<
                                 (poVar3,(this->super_TPZFront<long_double>).fFree.
                                         super_TPZManVector<int,_10>.super_TPZVec<int>.fStore
                                         [lVar10]);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Frontal Matrix ",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if ((0 < (this->super_TPZFront<long_double>).fData.fNElements) &&
     (0 < (this->super_TPZFront<long_double>).fFront)) {
    uVar7 = 0;
    do {
      if (0 < (this->super_TPZFront<long_double>).fFront) {
        uVar8 = 0;
        do {
          if (uVar7 < uVar8) {
            uVar6 = uVar8;
            if ((long)uVar8 < (long)uVar7) {
              uVar6 = uVar7;
            }
            uVar5 = uVar8;
            if ((long)uVar7 < (long)uVar8) {
              uVar5 = uVar7;
            }
          }
          else {
            uVar6 = uVar7;
            if ((long)uVar7 < (long)uVar8) {
              uVar6 = uVar8;
            }
            uVar5 = uVar7;
            if ((long)uVar8 < (long)uVar7) {
              uVar5 = uVar8;
            }
          }
          poVar3 = std::ostream::_M_insert<long_double>
                             (*(longdouble *)
                               ((long)(this->super_TPZFront<long_double>).fData.fStore +
                               uVar5 * 0x10 + ((uVar6 + 1) * uVar6 & 0xfffffffffffffffe) * 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          uVar8 = uVar8 + 1;
        } while ((long)uVar8 < (this->super_TPZFront<long_double>).fFront);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (this->super_TPZFront<long_double>).fFront);
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::Print(const char *name, std::ostream& out) const
{
	if(name) out << name << endl;
	int64_t i,j,loop_limit;
	
	
	out <<  "Frontal Matrix Size          "<< this->fFront << endl;
	out <<  "Maximum Frontal Matrix Size  "<< this->fMaxFront << endl;
	
	out << endl;
	out <<  "Local Indexation "<< endl;
	out <<  "Position  "<<" Local index"<< endl;
	for(i=0;i<this->fLocal.NElements();i++){
		out <<   i <<  "         "  << this->fLocal[i] << endl;
	}
	
	out << endl;
	out <<  "Global Indexation "<< endl;
	out <<  "Position  "<<" Global index"<< endl;
	
	for(i=0;i<this->fGlobal.NElements();i++){
		out <<   i <<  "            "<< this->fGlobal[i] << endl;
	}
	
	out << endl;
	out <<  "Local Freed Equatoins  "<< this->fFree.NElements() << endl;
	out <<  "position "<<   "Local Equation "<<endl;
	loop_limit=this->fFree.NElements();
	for(i=0;i<loop_limit;i++){
		out <<  i <<  "             " << this->fFree[i] << endl;
	}
	out <<  "Frontal Matrix "<< endl;
	if(this->fData.NElements() > 0) {
		for(i=0;i<this->fFront;i++){
			for(j=0;j<this->fFront;j++) out << ((i<j) ? Element(i,j) : Element(j,i)) <<  " ";
			out << endl;
		}
	}
}